

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O0

void reoProfileAplStart(reo_man *p)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  int local_3c;
  int i;
  double Half;
  double Res;
  reo_unit *pUnit;
  reo_unit *pTR;
  reo_unit *pER;
  reo_man *p_local;
  
  for (local_3c = 0; local_3c < p->nSupp; local_3c = local_3c + 1) {
    for (Res = (double)p->pPlanes[local_3c].pHead; Res != 0.0; Res = *(double *)((long)Res + 0x20))
    {
      *(undefined8 *)((long)Res + 0x28) = 0;
    }
  }
  for (local_3c = 0; local_3c < p->nTops; local_3c = local_3c + 1) {
    uVar1 = (ulong)p->pTops[local_3c] & 0xfffffffffffffffe;
    *(double *)(uVar1 + 0x28) = *(double *)(uVar1 + 0x28) + 1.0;
  }
  Half = 0.0;
  for (local_3c = 0; local_3c < p->nSupp; local_3c = local_3c + 1) {
    p->pPlanes[local_3c].statsCost = 0.0;
    for (Res = (double)p->pPlanes[local_3c].pHead; Res != 0.0; Res = *(double *)((long)Res + 0x20))
    {
      uVar1 = *(ulong *)((long)Res + 0x10) & 0xfffffffffffffffe;
      uVar2 = *(ulong *)((long)Res + 0x18) & 0xfffffffffffffffe;
      dVar3 = *(double *)((long)Res + 0x28) * 0.5;
      *(double *)(uVar1 + 0x28) = dVar3 + *(double *)(uVar1 + 0x28);
      *(double *)(uVar2 + 0x28) = dVar3 + *(double *)(uVar2 + 0x28);
      p->pPlanes[local_3c].statsCost =
           *(double *)((long)Res + 0x28) + p->pPlanes[local_3c].statsCost;
    }
    Half = p->pPlanes[local_3c].statsCost + Half;
  }
  p->pPlanes[p->nSupp].statsCost = 0.0;
  p->nAplCur = Half;
  p->nAplBeg = Half;
  return;
}

Assistant:

void reoProfileAplStart( reo_man * p )
{
    reo_unit * pER, * pTR;
    reo_unit * pUnit;
    double Res, Half;
    int i;

    // clean the weights of all nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            pUnit->Weight = 0.0;
    // to assign the node weights (the probability of visiting each node)
    // we visit the node after visiting its predecessors

    // set the probability of visits to the top nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->Weight += 1.0;

    // to compute the path length (the sum of products of edge weight by edge length)
    // we visit the nodes in any order (the above order will do)
    Res = 0.0;
    for ( i = 0; i < p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = 0.0;
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            pER  = Unit_Regular(pUnit->pE);
            pTR  = Unit_Regular(pUnit->pT);
            Half = 0.5 * pUnit->Weight;
            pER->Weight += Half;
            pTR->Weight += Half;
            // add to the path length
            p->pPlanes[i].statsCost += pUnit->Weight;
        }
        Res += p->pPlanes[i].statsCost;
    }
    p->pPlanes[p->nSupp].statsCost = 0.0;
    p->nAplBeg = p->nAplCur = Res;
}